

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O0

void __thiscall
CVmObjPattern::load_from_image(CVmObjPattern *this,vm_obj_id_t self,char *ptr,size_t len)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  CVmObjPattern *in_RDX;
  CVmObjPattern *in_RDI;
  CVmObjTable *unaff_retaddr;
  re_compiled_pattern *in_stack_ffffffffffffffc8;
  CVmObjPattern *pCVar3;
  vm_obj_id_t obj;
  
  pCVar3 = in_RDI;
  if ((in_RDI->super_CVmObject).ext_ == (char *)0x0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,0x18,in_RDI);
    (in_RDI->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  }
  obj = (vm_obj_id_t)((ulong)pCVar3 >> 0x20);
  get_ext(in_RDI);
  vmb_get_dh((char *)in_RDX,(vm_val_t *)in_stack_ffffffffffffffc8);
  set_pattern(in_RDX,in_stack_ffffffffffffffc8);
  CVmObjTable::request_post_load_init(unaff_retaddr,obj);
  return;
}

Assistant:

void CVmObjPattern::load_from_image(VMG_ vm_obj_id_t self, const char *ptr,
                                    size_t len)
{
    /* if we don't already have an extension, allocate one */
    if (ext_ == 0)
        ext_ = (char *)G_mem->get_var_heap()
               ->alloc_mem(sizeof(vmobj_pat_ext), this);

    /* get our source value */
    vmb_get_dh(ptr, &get_ext()->str);

    /* 
     *   We haven't compiled our pattern yet.  Note that it might not be
     *   possible to obtain the text of our string at this point, because it
     *   might be another object and thus might not have been loaded yet.
     *   So, note that we have no pattern yet, and request post-load
     *   initialization, so that we can compile our pattern after we know all
     *   of the other objects have been loaded.  
     */
    set_pattern(0);
    G_obj_table->request_post_load_init(self);
}